

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void reduce_one(Parser *p,Reduction *r)

{
  uint32 *puVar1;
  SNode **ppSVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  SNode *ps;
  ZNode *pZVar7;
  ZNode **ppZVar8;
  PNode *pn1;
  SNode *pSVar9;
  ZNode *pZVar10;
  SNode *pSVar11;
  ZNode *pZVar12;
  bool bVar13;
  int iVar14;
  VecZNode *pVVar15;
  PNode *pPVar16;
  ulong uVar17;
  ulong uVar18;
  PNode *pn2;
  uint uVar19;
  ulong uVar20;
  D_Reduction *r_00;
  PNode *pn0;
  ulong uVar21;
  ulong uVar22;
  VecVecZNode paths;
  
  ps = r->snode;
  r_00 = r->reduction;
  pZVar7 = r->znode;
  if (pZVar7 == (ZNode *)0x0) {
    pPVar16 = add_PNode(p,(uint)r_00->symbol,&ps->loc,(ps->loc).s,ps->last_pn,r_00,(VecZNode *)0x0,
                        (D_Shift *)0x0);
    if (pPVar16 != (PNode *)0x0) {
      goto_PNode(p,&ps->loc,pPVar16,ps);
    }
  }
  else {
    uVar3 = r_00->nelements;
    paths.n = 0;
    paths.v = (VecZNode **)0x0;
    if (uVar3 != 0) {
      pVVar15 = new_VecZNode(&paths,0,-1);
      paths.v = paths.e;
      uVar18 = (ulong)paths.n;
      paths.n = paths.n + 1;
      paths.e[uVar18] = pVVar15;
      build_paths_internal(pZVar7,&paths,0,(uint)uVar3,(uint)uVar3);
    }
    for (uVar18 = 0; uVar22 = (ulong)paths.n, uVar18 < uVar22; uVar18 = uVar18 + 1) {
      pVVar15 = paths.v[uVar18];
      if (r->new_snode != (SNode *)0x0) {
        uVar22 = 0;
        do {
          if ((pVVar15->v[r->new_depth]->sns).n == uVar22) goto LAB_0012abe7;
          ppSVar2 = (pVVar15->v[r->new_depth]->sns).v + uVar22;
          uVar22 = uVar22 + 1;
        } while (*ppSVar2 != r->new_snode);
      }
      uVar4 = pVVar15->n;
      ppZVar8 = pVVar15->v;
      pPVar16 = (*ppZVar8)->pn;
      if (uVar4 < 2) {
LAB_0012ab54:
        p->reductions = p->reductions + 1;
        pZVar7 = ppZVar8[uVar3 - 1];
        r_00 = r->reduction;
        pPVar16 = add_PNode(p,(uint)r_00->symbol,&(pZVar7->pn->parse_node).start_loc,(ps->loc).s,
                            pPVar16,r_00,pVVar15,(D_Shift *)0x0);
        if (pPVar16 != (PNode *)0x0) {
          for (uVar22 = 0; uVar22 < (pZVar7->sns).n; uVar22 = uVar22 + 1) {
            goto_PNode(p,&ps->loc,pPVar16,(pZVar7->sns).v[uVar22]);
          }
        }
      }
      else {
        uVar19 = 0;
        pn0 = pPVar16;
        if (pPVar16->op_assoc != ASSOC_NONE) goto LAB_0012a951;
        pn0 = ppZVar8[1]->pn;
        if (pn0->op_assoc == ASSOC_NONE) goto LAB_0012ab54;
        if (pPVar16->assoc == ASSOC_NONE) {
          uVar19 = 1;
LAB_0012a951:
          if (uVar4 <= uVar19 + 1) {
            pZVar7 = ppZVar8[uVar19];
            uVar4 = (pZVar7->sns).n;
            for (uVar22 = 0; uVar22 != uVar4; uVar22 = uVar22 + 1) {
              pSVar11 = (pZVar7->sns).v[uVar22];
              uVar19 = (pSVar11->zns).n;
              for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
                pZVar12 = (pSVar11->zns).v[uVar20];
                if (pZVar12 != (ZNode *)0x0) {
                  uVar5 = (pZVar12->sns).n;
                  for (uVar17 = 0; uVar17 != uVar5; uVar17 = uVar17 + 1) {
                    pSVar9 = (pZVar12->sns).v[uVar17];
                    uVar6 = (pSVar9->zns).n;
                    for (uVar21 = 0; uVar6 != uVar21; uVar21 = uVar21 + 1) {
                      pZVar10 = (pSVar9->zns).v[uVar21];
                      if ((pZVar10 != (ZNode *)0x0) &&
                         (iVar14 = check_assoc_priority(pn0,pZVar12->pn,pZVar10->pn), iVar14 == 0))
                      goto LAB_0012ab54;
                    }
                  }
                }
              }
            }
            goto LAB_0012ab54;
          }
          pZVar7 = ppZVar8[uVar19 + 1];
          pn1 = pZVar7->pn;
          if ((uVar19 | 2) < uVar4) {
            pn2 = ppZVar8[uVar19 | 2]->pn;
          }
          else {
            uVar4 = (pZVar7->sns).n;
            bVar13 = false;
            for (uVar22 = 0; uVar22 != uVar4; uVar22 = uVar22 + 1) {
              pSVar11 = (pZVar7->sns).v[uVar22];
              uVar19 = (pSVar11->zns).n;
              for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
                pZVar12 = (pSVar11->zns).v[uVar20];
                if ((pZVar12 != (ZNode *)0x0) &&
                   (iVar14 = check_assoc_priority(pn0,pn1,pZVar12->pn), iVar14 == 0))
                goto LAB_0012ab54;
                bVar13 = true;
              }
            }
            if (bVar13) goto LAB_0012abe7;
            pn2 = (PNode *)0x0;
          }
          iVar14 = check_assoc_priority(pn0,pn1,pn2);
          if (iVar14 == 0) goto LAB_0012ab54;
        }
        else {
          uVar19 = 1;
          iVar14 = check_child(pn0->op_priority,pn0->op_assoc,pPVar16->priority,pPVar16->assoc,1,
                               (int)r_00);
          if (iVar14 != 0) goto LAB_0012a951;
        }
      }
LAB_0012abe7:
    }
    for (uVar18 = 0; uVar18 < uVar22; uVar18 = uVar18 + 1) {
      pVVar15 = paths.v[uVar18];
      ppZVar8 = pVVar15->v;
      if (ppZVar8 != pVVar15->e && ppZVar8 != (ZNode **)0x0) {
        free(ppZVar8);
        pVVar15 = paths.v[uVar18];
      }
      pVVar15->n = 0;
      pVVar15->v = (ZNode **)0x0;
      if (paths.v[uVar18] != &path1) {
        free(paths.v[uVar18]);
      }
      uVar22 = (ulong)paths.n;
    }
    if (paths.v != paths.e && paths.v != (VecZNode **)0x0) {
      free(paths.v);
    }
    paths.n = 0;
    paths.v = (VecZNode **)0x0;
  }
  puVar1 = &ps->refcount;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    free_SNode(p,ps);
  }
  r->next = p->free_reductions;
  p->free_reductions = r;
  return;
}

Assistant:

static void reduce_one(Parser *p, Reduction *r) {
  SNode *sn = r->snode;
  PNode *pn, *last_pn;
  ZNode *first_z;
  uint i, j, n = r->reduction->nelements;
  VecVecZNode paths;
  VecZNode *path;

  if (!r->znode) { /* epsilon reduction */
    if ((pn = add_PNode(p, r->reduction->symbol, &sn->loc, sn->loc.s, sn->last_pn, r->reduction, 0, 0)))
      goto_PNode(p, &sn->loc, pn, sn);
  } else {
    DBG(printf("reduce %d %p %d\n", (int)(r->snode->state - p->t->state), (void *)sn, n));
    vec_clear(&paths);
    build_paths(r->znode, &paths, n);
    for (i = 0; i < paths.n; i++) {
      path = paths.v[i];
      if (r->new_snode) { /* prune paths by new right epsilon node */
        for (j = 0; j < path->v[r->new_depth]->sns.n; j++)
          if (path->v[r->new_depth]->sns.v[j] == r->new_snode) break;
        if (j >= path->v[r->new_depth]->sns.n) continue;
      }
      if (check_path_priorities(path)) continue;
      p->reductions++;
      last_pn = path->v[0]->pn;
      first_z = path->v[n - 1];
      pn = add_PNode(p, r->reduction->symbol, &first_z->pn->parse_node.start_loc, sn->loc.s, last_pn, r->reduction,
                     path, NULL);
      if (pn)
        for (j = 0; j < first_z->sns.n; j++) goto_PNode(p, &sn->loc, pn, first_z->sns.v[j]);
    }
    free_paths(&paths);
  }
  unref_sn(p, sn);
  r->next = p->free_reductions;
  p->free_reductions = r;
}